

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O2

void __thiscall leveldb::TableBuilder::Add(TableBuilder *this,Slice *key,Slice *value)

{
  long lVar1;
  Rep *pRVar2;
  Comparator *pCVar3;
  uint __line;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *__assertion;
  long in_FS_OFFSET;
  Slice local_70;
  Slice local_60;
  string handle_encoding;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = this->rep_;
  if (pRVar2->closed == true) {
    __assertion = "!r->closed";
    __line = 0x60;
LAB_00a551a2:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/table_builder.cc"
                  ,__line,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
  }
  bVar4 = ok(this);
  if (bVar4) {
    if (0 < pRVar2->num_entries) {
      pCVar3 = (pRVar2->options).comparator;
      handle_encoding._M_dataplus._M_p = (pRVar2->last_key)._M_dataplus._M_p;
      handle_encoding._M_string_length = (pRVar2->last_key)._M_string_length;
      iVar5 = (*pCVar3->_vptr_Comparator[2])(pCVar3,key);
      if (iVar5 < 1) {
        __assertion = "r->options.comparator->Compare(key, Slice(r->last_key)) > 0";
        __line = 99;
        goto LAB_00a551a2;
      }
    }
    if (pRVar2->pending_index_entry == true) {
      if ((pRVar2->data_block).buffer_._M_string_length != 0) {
        __assertion = "r->data_block.empty()";
        __line = 0x67;
        goto LAB_00a551a2;
      }
      pCVar3 = (pRVar2->options).comparator;
      (*pCVar3->_vptr_Comparator[4])(pCVar3,&pRVar2->last_key,key);
      handle_encoding._M_dataplus._M_p = (pointer)&handle_encoding.field_2;
      handle_encoding._M_string_length = 0;
      handle_encoding.field_2._M_local_buf[0] = '\0';
      BlockHandle::EncodeTo(&pRVar2->pending_handle,&handle_encoding);
      local_60.data_ = (pRVar2->last_key)._M_dataplus._M_p;
      local_60.size_ = (pRVar2->last_key)._M_string_length;
      local_70.data_ = handle_encoding._M_dataplus._M_p;
      local_70.size_ = handle_encoding._M_string_length;
      BlockBuilder::Add(&pRVar2->index_block,&local_60,&local_70);
      pRVar2->pending_index_entry = false;
      std::__cxx11::string::~string((string *)&handle_encoding);
    }
    if (pRVar2->filter_block != (FilterBlockBuilder *)0x0) {
      FilterBlockBuilder::AddKey(pRVar2->filter_block,key);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&pRVar2->last_key,key->data_,key->size_);
    pRVar2->num_entries = pRVar2->num_entries + 1;
    BlockBuilder::Add(&pRVar2->data_block,key,value);
    sVar6 = BlockBuilder::CurrentSizeEstimate(&pRVar2->data_block);
    if ((pRVar2->options).block_size <= sVar6) {
      Flush(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TableBuilder::Add(const Slice& key, const Slice& value) {
  Rep* r = rep_;
  assert(!r->closed);
  if (!ok()) return;
  if (r->num_entries > 0) {
    assert(r->options.comparator->Compare(key, Slice(r->last_key)) > 0);
  }

  if (r->pending_index_entry) {
    assert(r->data_block.empty());
    r->options.comparator->FindShortestSeparator(&r->last_key, key);
    std::string handle_encoding;
    r->pending_handle.EncodeTo(&handle_encoding);
    r->index_block.Add(r->last_key, Slice(handle_encoding));
    r->pending_index_entry = false;
  }

  if (r->filter_block != nullptr) {
    r->filter_block->AddKey(key);
  }

  r->last_key.assign(key.data(), key.size());
  r->num_entries++;
  r->data_block.Add(key, value);

  const size_t estimated_block_size = r->data_block.CurrentSizeEstimate();
  if (estimated_block_size >= r->options.block_size) {
    Flush();
  }
}